

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaBlockMetadata_TLSF::PrintDetailedMap(VmaBlockMetadata_TLSF *this,VmaJsonWriter *json)

{
  Block *pBVar1;
  undefined1 uVar2;
  VkAllocationCallbacks *pCallbacks;
  Block **ppBVar3;
  VmaJsonWriter *json_00;
  VmaBlockMetadata *in_RSI;
  VmaBlockMetadata *in_RDI;
  Block *block_1;
  VmaDetailedStatistics stats;
  Block *block;
  size_t i;
  VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>
  blockList;
  VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*> allocator;
  size_t blockCount;
  VmaJsonWriter *in_stack_ffffffffffffff08;
  VmaBlockMetadata *in_stack_ffffffffffffff10;
  VmaJsonWriter *in_stack_ffffffffffffff18;
  VmaBlockMetadata *in_stack_ffffffffffffff20;
  VmaJsonWriter *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 local_a0 [80];
  Block *local_50;
  size_t local_48;
  VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>
  local_40;
  VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*> local_20;
  size_t local_18;
  VmaBlockMetadata *local_10;
  
  local_18 = (long)in_RDI[1]._vptr_VmaBlockMetadata + in_RDI[1].m_Size;
  local_10 = in_RSI;
  pCallbacks = VmaBlockMetadata::GetAllocationCallbacks(in_RDI);
  VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>::VmaStlAllocator(&local_20,pCallbacks);
  VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>::
  VmaVector((VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>
             *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
            (size_t)in_stack_ffffffffffffff28,
            (VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*> *)in_stack_ffffffffffffff20);
  local_48 = local_18;
  for (local_50 = *(Block **)(in_RDI[9].m_Size + 0x10); pBVar1 = local_50, local_50 != (Block *)0x0;
      local_50 = local_50->prevPhysical) {
    local_48 = local_48 - 1;
    ppBVar3 = VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>
              ::operator[](&local_40,local_48);
    *ppBVar3 = pBVar1;
  }
  VmaClearDetailedStatistics((VmaDetailedStatistics *)0x2f1240);
  (*in_RDI->_vptr_VmaBlockMetadata[0xe])(in_RDI,local_a0);
  VmaBlockMetadata::PrintDetailedMap_Begin
            ((VmaBlockMetadata *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,(VkDeviceSize)in_stack_ffffffffffffff20,
             (size_t)in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
  for (; local_48 < local_18; local_48 = local_48 + 1) {
    ppBVar3 = VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>
              ::operator[](&local_40,local_48);
    pBVar1 = *ppBVar3;
    uVar2 = Block::IsFree(pBVar1);
    if ((bool)uVar2) {
      VmaBlockMetadata::PrintDetailedMap_UnusedRange
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (VkDeviceSize)in_stack_ffffffffffffff10,(VkDeviceSize)in_stack_ffffffffffffff08);
    }
    else {
      in_stack_ffffffffffffff18 = (VmaJsonWriter *)pBVar1->offset;
      in_stack_ffffffffffffff20 = (VmaBlockMetadata *)pBVar1->size;
      in_stack_ffffffffffffff10 = local_10;
      json_00 = (VmaJsonWriter *)Block::UserData(pBVar1);
      VmaBlockMetadata::PrintDetailedMap_Allocation
                ((VmaBlockMetadata *)CONCAT17(uVar2,in_stack_ffffffffffffff30),json_00,
                 (VkDeviceSize)in_stack_ffffffffffffff20,(VkDeviceSize)in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10);
    }
  }
  if (*(long *)(in_RDI[9].m_Size + 8) != 0) {
    VmaBlockMetadata::PrintDetailedMap_UnusedRange
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (VkDeviceSize)in_stack_ffffffffffffff10,(VkDeviceSize)in_stack_ffffffffffffff08);
  }
  VmaBlockMetadata::PrintDetailedMap_End(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>::
  ~VmaVector((VmaVector<VmaBlockMetadata_TLSF::Block_*,_VmaStlAllocator<VmaBlockMetadata_TLSF::Block_*>_>
              *)0x2f13c9);
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::PrintDetailedMap(class VmaJsonWriter& json) const
{
    size_t blockCount = m_AllocCount + m_BlocksFreeCount;
    VmaStlAllocator<Block*> allocator(GetAllocationCallbacks());
    VmaVector<Block*, VmaStlAllocator<Block*>> blockList(blockCount, allocator);

    size_t i = blockCount;
    for (Block* block = m_NullBlock->prevPhysical; block != VMA_NULL; block = block->prevPhysical)
    {
        blockList[--i] = block;
    }
    VMA_ASSERT(i == 0);

    VmaDetailedStatistics stats;
    VmaClearDetailedStatistics(stats);
    AddDetailedStatistics(stats);

    PrintDetailedMap_Begin(json,
        stats.statistics.blockBytes - stats.statistics.allocationBytes,
        stats.statistics.allocationCount,
        stats.unusedRangeCount);

    for (; i < blockCount; ++i)
    {
        Block* block = blockList[i];
        if (block->IsFree())
            PrintDetailedMap_UnusedRange(json, block->offset, block->size);
        else
            PrintDetailedMap_Allocation(json, block->offset, block->size, block->UserData());
    }
    if (m_NullBlock->size > 0)
        PrintDetailedMap_UnusedRange(json, m_NullBlock->offset, m_NullBlock->size);

    PrintDetailedMap_End(json);
}